

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

int qMetaTypeTypeInternal(QByteArrayView name)

{
  int iVar1;
  char *__s2;
  long lVar2;
  int iVar3;
  long local_38;
  
  iVar3 = (int)name.m_size;
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    __s2 = "bool";
    lVar2 = 0;
    local_38 = 0x1de7b0;
    do {
      if ((*(int *)((long)&types[0].typeNameLength + lVar2) == iVar3) &&
         (iVar1 = bcmp(name.m_data,__s2,(long)iVar3), iVar1 == 0)) {
        local_38 = (long)&types[0].typeName + lVar2;
        break;
      }
      __s2 = *(char **)((long)&types[1].typeName + lVar2);
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x5a0);
    iVar3 = *(int *)(local_38 + 0xc);
  }
  return iVar3;
}

Assistant:

Q_CORE_EXPORT int qMetaTypeTypeInternal(QByteArrayView name)
{
    return qMetaTypeTypeImpl<DontNormalizeType>(name.data(), name.size());
}